

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O2

void use_smart_pointers(void)

{
  Report *pRVar1;
  auto_ptr<L16_1::Report> ps;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0 [3];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ps_3;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = (Report *)operator_new(0x20);
  std::__cxx11::string::string((string *)&local_38,"I\'m using auto pointer!",(allocator *)&ps_3);
  L16_1::Report::Report(pRVar1,&local_38);
  ps._M_ptr = pRVar1;
  std::__cxx11::string::~string((string *)&local_38);
  L16_1::Report::comment(pRVar1);
  std::auto_ptr<L16_1::Report>::~auto_ptr(&ps);
  pRVar1 = (Report *)operator_new(0x20);
  std::__cxx11::string::string((string *)&local_58,"I\'m using shared pointer!",(allocator *)&ps_3);
  L16_1::Report::Report(pRVar1,&local_58);
  std::__shared_ptr<L16_1::Report,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<L16_1::Report,void>
            ((__shared_ptr<L16_1::Report,(__gnu_cxx::_Lock_policy)2> *)&ps,pRVar1);
  std::__cxx11::string::~string((string *)&local_58);
  L16_1::Report::comment(ps._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a0);
  pRVar1 = (Report *)operator_new(0x20);
  std::__cxx11::string::string((string *)&local_78,"I\'m using unique pointer!",(allocator *)&ps_3);
  L16_1::Report::Report(pRVar1,&local_78);
  ps._M_ptr = pRVar1;
  std::__cxx11::string::~string((string *)&local_78);
  L16_1::Report::comment(pRVar1);
  std::unique_ptr<L16_1::Report,_std::default_delete<L16_1::Report>_>::~unique_ptr
            ((unique_ptr<L16_1::Report,_std::default_delete<L16_1::Report>_> *)&ps);
  std::__cxx11::string::string((string *)&ps,"Just curious about c++...",(allocator *)&ps_3);
  std::__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::__cxx11::string,void>
            ((__shared_ptr<std::__cxx11::string,(__gnu_cxx::_Lock_policy)2> *)&ps_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ps);
  std::operator<<((ostream *)&std::cout,"s: ");
}

Assistant:

void use_smart_pointers() {
    using namespace L16_1;
    using namespace std;

    {
        auto_ptr<Report> ps(new Report("I'm using auto pointer!"));
        //  ps is actually an object. it override operator->
        ps->comment();
    }

    {
        shared_ptr<Report> ps(new Report("I'm using shared pointer!"));
        ps->comment();
    }

    {
        unique_ptr<Report> ps(new Report("I'm using unique pointer!"));
        //  same as above...
        ps->comment();
    }

    {
        //  this is auto variable, it is on stack, NOT heap
        string s("Just curious about c++...");

        //  use address on heap, when destruct, will cause 'delete xxx', that is actually an error
        shared_ptr<string> ps(&s);

        cout << "s: " << s;
    }
}